

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O3

void __thiscall
TPZMHMixedHybridMeshControl::AdjustBoundaryConditionsOfFractures(TPZMHMixedHybridMeshControl *this)

{
  int iVar1;
  TPZGeoMesh *pTVar2;
  long lVar3;
  TPZGeoEl *gel;
  int iVar4;
  TPZGeoEl **ppTVar5;
  long nelem;
  
  TPZGeoMesh::ResetReference
            (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer);
  TPZCompMesh::LoadReferences(((this->super_TPZMHMixedMeshControl).fFluxMesh.fRef)->fPointer);
  pTVar2 = ((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer;
  lVar3 = (pTVar2->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < lVar3) {
    iVar1 = pTVar2->fDim;
    nelem = 0;
    do {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef
                             )->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,nelem);
      gel = *ppTVar5;
      if (gel != (TPZGeoEl *)0x0) {
        iVar4 = (**(code **)(*(long *)gel + 0x210))(gel);
        if ((iVar4 == iVar1 + -2) &&
           (gel->fMatId ==
            (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fBoundaryWrapMatId)) {
          ApplyNeighbourBoundaryCondition(this,gel);
        }
      }
      nelem = nelem + 1;
    } while (lVar3 != nelem);
  }
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::AdjustBoundaryConditionsOfFractures()
{
    fGMesh->ResetReference();
    fFluxMesh->LoadReferences();
    int meshdim = fGMesh->Dimension();
    int64_t nel = fGMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if(gel && gel->Dimension() == meshdim-2 && gel->MaterialId() == fBoundaryWrapMatId)
        {
            ApplyNeighbourBoundaryCondition(gel);
        }
    }
}